

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int Cba_NtkIsSeq(Cba_Ntk_t *p)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  byte bVar4;
  Cba_Ntk_t *p_00;
  long lVar5;
  
  iVar3 = 1;
  if (((p->field_0x14 & 4) == 0) && (iVar3 = 0, (p->field_0x14 & 2) == 0)) {
    bVar4 = 2;
    if (1 < (p->vObjType).nSize) {
      lVar5 = 1;
      do {
        if ((p->vObjType).nSize <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        bVar1 = (p->vObjType).pArray[lVar5];
        if (0xffffffa8 < bVar1 - 0x5a) {
          if (bVar1 == 3) {
            if ((p->vObjFunc).nSize < 1) {
              uVar2 = 0;
            }
            else {
              Vec_IntFillExtra(&p->vObjFunc,(int)lVar5 + 1,(int)in_RDX);
              if ((p->vObjFunc).nSize <= lVar5) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar2 = (p->vObjFunc).pArray[lVar5];
            }
            if (((int)uVar2 < 1) || ((p->pDesign->vNtks).nSize <= (int)uVar2)) {
              p_00 = (Cba_Ntk_t *)0x0;
            }
            else {
              p_00 = (Cba_Ntk_t *)(p->pDesign->vNtks).pArray[uVar2];
            }
            iVar3 = Cba_NtkIsSeq(p_00);
            in_RDX = extraout_RDX;
            if (iVar3 != 0) {
LAB_003ebd1b:
              iVar3 = 1;
              bVar4 = 4;
              goto LAB_003ebd0c;
            }
          }
          else if (0xfffffff3 < bVar1 - 0x58) goto LAB_003ebd1b;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (p->vObjType).nSize);
    }
    iVar3 = 0;
LAB_003ebd0c:
    p->field_0x14 = p->field_0x14 | bVar4;
  }
  return iVar3;
}

Assistant:

static inline int Cba_NtkIsSeq( Cba_Ntk_t * p )
{
    int iObj;
    if ( p->fSeq )
        return 1;
    if ( p->fComb )
        return 0;
    assert( !p->fSeq && !p->fComb );
    Cba_NtkForEachBox( p, iObj )
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            if ( Cba_NtkIsSeq( Cba_ObjNtk(p, iObj) ) )
            {
                p->fSeq = 1;
                return 1;
            }
        }
        else if ( Cba_ObjIsSeq(p, iObj) )
        {
            p->fSeq = 1;
            return 1;
        }
    p->fComb = 1;
    return 0;
}